

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O1

void leccalc::processinputfile
               (uint *samplesize,
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *event_to_periods,set<int,_std::less<int>,_std::allocator<int>_> *summaryids,
               vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
               *out_loss,bool useReturnPeriodFile,aggreports *agg)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  uint uVar10;
  undefined3 in_register_00000081;
  bool bVar11;
  sampleslevelRec sr_1;
  sampleslevelRec sr;
  summarySampleslevelHeader sh;
  int local_84;
  float local_80;
  key_type local_7c;
  uint local_70;
  int local_6c;
  int local_68 [2];
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_60;
  _Base_ptr local_58;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_50;
  size_t local_48;
  _Base_ptr local_40;
  ulong local_38;
  
  local_60 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)summaryids;
  checkinputfile(samplesize,(FILE *)_stdin,agg);
  local_58 = &(event_to_periods->_M_t)._M_impl.super__Rb_tree_header._M_header;
  sVar5 = 1;
  local_70 = CONCAT31(in_register_00000081,useReturnPeriodFile) ^ 1;
  local_50 = event_to_periods;
  uVar10 = local_70;
  do {
    if (sVar5 == 0) {
      return;
    }
    sVar6 = fread(&local_6c,0xc,1,_stdin);
    sVar5 = sVar6;
    iVar2 = local_7c.summary_id;
    sVar3 = local_48;
    if (sVar6 == 1) {
      p_Var7 = local_58;
      for (p_Var9 = (local_50->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < local_6c])
      {
        if (local_6c <= (int)p_Var9[1]._M_color) {
          p_Var7 = p_Var9;
        }
      }
      p_Var9 = local_58;
      if ((p_Var7 != local_58) && (p_Var9 = p_Var7, local_6c < (int)p_Var7[1]._M_color)) {
        p_Var9 = local_58;
      }
      if (p_Var9 == local_58) {
        do {
          sVar5 = fread(&local_7c,8,1,_stdin);
          iVar2 = local_7c.summary_id;
          sVar3 = local_48;
          if (sVar5 != 1) break;
        } while (local_7c.summary_id != 0);
      }
      else {
        local_40 = p_Var9;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_60,local_68);
        sVar5 = fread(&local_84,8,1,_stdin);
        sVar4 = sVar6;
        fVar1 = local_80;
        iVar2 = local_7c.summary_id;
        local_7c.summary_id = local_68[0];
        sVar3 = local_48;
        while ((local_48 = sVar4, local_80 = fVar1, local_68[0] = local_7c.summary_id, sVar5 == 1 &&
               (local_84 != 0))) {
          if ((1 < local_84 + 5U) && ((fVar1 <= 0.0 & (byte)uVar10) == 0)) {
            p_Var9 = ((_Base_ptr)((long)local_40 + 0x20))->_M_parent;
            p_Var7 = ((_Base_ptr)((long)local_40 + 0x20))->_M_left;
            sVar6 = local_48;
            iVar2 = local_7c.summary_id;
            uVar10 = local_70;
            if (p_Var9 != p_Var7) {
              bVar11 = local_84 != -1;
              local_38 = (ulong)bVar11;
              do {
                local_7c.period_no = p_Var9->_M_color;
                pmVar8 = std::
                         map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                         ::operator[]((out_loss->
                                      super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + bVar11,&local_7c)
                ;
                pmVar8->agg_out_loss = pmVar8->agg_out_loss + fVar1;
                pmVar8 = std::
                         map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                         ::operator[]((out_loss->
                                      super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + bVar11,&local_7c)
                ;
                if (pmVar8->max_out_loss <= fVar1 && fVar1 != pmVar8->max_out_loss) {
                  pmVar8 = std::
                           map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                           ::operator[]((map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                         *)((long)&(((out_loss->
                                                                                                          
                                                  super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->_M_t)
                                                  ._M_impl.field_0x0 +
                                           (ulong)(uint)((int)local_38 * 0x30)),&local_7c);
                  pmVar8->max_out_loss = fVar1;
                }
                p_Var9 = (_Base_ptr)&p_Var9->field_0x4;
                sVar6 = local_48;
                iVar2 = local_7c.summary_id;
                uVar10 = local_70;
              } while (p_Var9 != p_Var7);
            }
          }
          local_7c.summary_id = iVar2;
          sVar5 = fread(&local_84,8,1,_stdin);
          sVar4 = local_48;
          fVar1 = local_80;
          iVar2 = local_7c.summary_id;
          local_7c.summary_id = local_68[0];
          sVar3 = local_48;
        }
      }
    }
    local_48 = sVar3;
    local_7c.summary_id = iVar2;
    if (sVar6 != 1) {
      return;
    }
  } while( true );
}

Assistant:

void processinputfile(
		unsigned int& samplesize,
		const std::map<int, std::vector<int> >& event_to_periods,
		std::set<int> &summaryids,
		std::vector<std::map<outkey2, OutLosses>> &out_loss,
		const bool useReturnPeriodFile, aggreports &agg)
	{
		checkinputfile(samplesize, stdin, agg);

		// read_event()
		size_t i = 1;
		while (i != 0) {
			summarySampleslevelHeader sh;
			i = fread(&sh, sizeof(sh), 1, stdin);
			if (i != 1) {
				break;
			}

			// discard samples if eventis not found
			std::map<int, std::vector<int> >::const_iterator iter = event_to_periods.find(sh.event_id);
			if (iter == event_to_periods.end()) { // Event not found so don't process it, but read samples
				while (i != 0) {
					sampleslevelRec sr;
					i = fread(&sr, sizeof(sr), 1, stdin);
					if (i != 1 || sr.sidx == 0) {
						break;
					}
				}
				continue;
			}

			summaryids.insert(sh.summary_id);

			// read_samples_and_compute_lec()
			while (i != 0) {
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, stdin);
				if (i != 1) {
					break;
				}

				if (sr.sidx == 0) {			//  end of sidx stream
					break;
				}

				if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) {
					continue;
				}

				if (sr.loss > 0.0 || useReturnPeriodFile)
				{
					dolecoutputaggsummary(sh.summary_id, sr.sidx, sr.loss, iter->second, out_loss);
				}
			}
		}
	}